

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntt.cpp
# Opt level: O2

void ntt(int k,vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *v,bool inv)

{
  pointer puVar1;
  unsigned_long_long uVar2;
  int iVar3;
  uint uVar4;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *pvVar5;
  ulong uVar6;
  undefined4 in_register_0000003c;
  ulong uVar7;
  int k_00;
  int i;
  ulong uVar8;
  long lVar9;
  undefined1 auStack_78 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> even;
  undefined1 auStack_58 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> odd;
  
  odd.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(in_register_0000003c,k);
  if (k != 0) {
    even.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    odd.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_78 = (undefined1  [8])0x0;
    even.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_58 = (undefined1  [8])0x0;
    odd.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    lVar9 = 0;
    for (uVar8 = 0;
        puVar1 = (v->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                 _M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(v->
                              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
        uVar8 = uVar8 + 1) {
      pvVar5 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_58;
      if ((uVar8 & 1) == 0) {
        pvVar5 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_78;
      }
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (pvVar5,(value_type *)((long)puVar1 + lVar9));
      lVar9 = lVar9 + 8;
    }
    iVar3 = (int)odd.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    k_00 = iVar3 + -1;
    ntt(k_00,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_78,inv);
    ntt(k_00,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_58,inv);
    pvVar5 = &wInv;
    if (!inv) {
      pvVar5 = &w;
    }
    uVar2 = (pvVar5->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
            _M_impl.super__Vector_impl_data._M_start[iVar3];
    uVar4 = 1 << ((byte)k_00 & 0x1f);
    uVar8 = 0;
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    puVar1 = (v->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = 1;
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      puVar1[uVar8] =
           ((*(pointer)((long)auStack_58 + uVar8 * 8) * uVar6) % 0xc0000001 +
           *(pointer)((long)auStack_78 + uVar8 * 8)) % 0xc0000001;
      puVar1[(long)(int)uVar4 + uVar8] =
           ((*(pointer)((long)auStack_78 + uVar8 * 8) -
            (*(pointer)((long)auStack_58 + uVar8 * 8) * uVar6) % 0xc0000001) + 0xc0000001) %
           0xc0000001;
      uVar6 = (uVar6 * uVar2) % 0xc0000001;
    }
    std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_58);
    std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_78);
  }
  return;
}

Assistant:

void ntt(int k, vector<ull>& v, bool inv) { // n = 2^k
    if (!k) return;
    vector<ull> even, odd;
    rep(i, 0, v.size()) ((i % 2) ? odd : even).push_back(v[i]);
    ntt(k - 1, even, inv);
    ntt(k - 1, odd, inv);
    // (2^k)-th root of unity: omega1^(2^k) = 1 (mod P here)
    ull omega1 = w[k];
    if (inv) omega1 = wInv[k];
    ull omega = 1;
    rep(i, 0, (1 << (k - 1))) {
        v[i] = (even[i] + (omega * odd[i]) % P) % P;
        v[i + (1 << (k - 1))] = (P + even[i] - (omega * odd[i]) % P) % P;
        omega = (omega1 * omega) % P;
    }
}